

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathRegisterVariableNS
              (xmlXPathContextPtr ctxt,xmlChar *name,xmlChar *ns_uri,xmlXPathObjectPtr value)

{
  int iVar1;
  xmlHashTablePtr pxVar2;
  
  if (name != (xmlChar *)0x0 && ctxt != (xmlXPathContextPtr)0x0) {
    if (ctxt->varHash == (xmlHashTablePtr)0x0) {
      pxVar2 = xmlHashCreate(0);
      ctxt->varHash = pxVar2;
    }
    pxVar2 = ctxt->varHash;
    if (pxVar2 != (xmlHashTablePtr)0x0) {
      if (value != (xmlXPathObjectPtr)0x0) {
        iVar1 = xmlHashUpdateEntry2(pxVar2,name,ns_uri,value,xmlXPathFreeObjectEntry);
        return iVar1;
      }
      iVar1 = xmlHashRemoveEntry2(pxVar2,name,ns_uri,xmlXPathFreeObjectEntry);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int
xmlXPathRegisterVariableNS(xmlXPathContextPtr ctxt, const xmlChar *name,
			   const xmlChar *ns_uri,
			   xmlXPathObjectPtr value) {
    if (ctxt == NULL)
	return(-1);
    if (name == NULL)
	return(-1);

    if (ctxt->varHash == NULL)
	ctxt->varHash = xmlHashCreate(0);
    if (ctxt->varHash == NULL)
	return(-1);
    if (value == NULL)
        return(xmlHashRemoveEntry2(ctxt->varHash, name, ns_uri,
	                           xmlXPathFreeObjectEntry));
    return(xmlHashUpdateEntry2(ctxt->varHash, name, ns_uri,
			       (void *) value, xmlXPathFreeObjectEntry));
}